

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void firstStage(vector<Crawler_*,_std::allocator<Crawler_*>_> *crawlers,Logger *logger)

{
  _List_node_base *p_Var1;
  ostream *poVar2;
  uint i;
  long lVar3;
  char cVar4;
  _List_node_base *p_Var5;
  uint i_2;
  uint j;
  uint uVar6;
  ulong uVar7;
  list<bdNodeId,_std::allocator<bdNodeId>_> tempIDStorage;
  undefined1 local_78 [32];
  Logger *local_58;
  ulong local_50;
  _List_node_base local_48;
  undefined8 local_38;
  
  lVar3 = 0;
  local_58 = logger;
  do {
    Crawler::startDht((crawlers->super__Vector_base<Crawler_*,_std::allocator<Crawler_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar3]);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x100);
  Logger::enable(local_58,true);
  local_38 = 0;
  uVar7 = 0;
  local_48._M_next = &local_48;
  local_48._M_prev = &local_48;
  do {
    sleep(0xf);
    Logger::getDiscoveredPeers_abi_cxx11_();
    local_50 = uVar7;
    std::__cxx11::list<bdNodeId,_std::allocator<bdNodeId>_>::merge
              ((list<bdNodeId,_std::allocator<bdNodeId>_> *)&local_48,
               (list<bdNodeId,_std::allocator<bdNodeId>_> *)local_78);
    p_Var5 = (_List_node_base *)local_78._0_8_;
    if ((_List_node_base *)local_78._0_8_ != (_List_node_base *)local_78) {
      do {
        p_Var1 = p_Var5->_M_next;
        operator_delete(p_Var5,0x28);
        p_Var5 = p_Var1;
      } while (p_Var1 != (_List_node_base *)local_78);
    }
    lVar3 = 0;
    do {
      Crawler::enable((crawlers->super__Vector_base<Crawler_*,_std::allocator<Crawler_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar3],false);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x100);
    uVar7 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Waiting for crawler ",0x14);
      cVar4 = '\x03' - (uVar7 < 100);
      if (uVar7 < 10) {
        cVar4 = '\x01';
      }
      local_78._0_8_ = local_78 + 0x10;
      std::__cxx11::string::_M_construct((ulong)local_78,cVar4);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)local_78._0_8_,local_78._8_4_,(uint)uVar7);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_78._0_8_,
                          CONCAT44(local_78._12_4_,local_78._8_4_));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if ((_List_node_base *)local_78._0_8_ != (_List_node_base *)(local_78 + 0x10)) {
        operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
      }
      Crawler::enableDht((crawlers->super__Vector_base<Crawler_*,_std::allocator<Crawler_*>_>).
                         _M_impl.super__Vector_impl_data._M_start[uVar7],false);
      uVar7 = uVar7 + 1;
    } while (uVar7 != 0x100);
    lVar3 = 0;
    do {
      Crawler::getToCheckList_abi_cxx11_
                ((list<bdNodeId,_std::allocator<bdNodeId>_> *)local_78,
                 (crawlers->super__Vector_base<Crawler_*,_std::allocator<Crawler_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar3]);
      std::__cxx11::list<bdNodeId,_std::allocator<bdNodeId>_>::merge
                ((list<bdNodeId,_std::allocator<bdNodeId>_> *)&local_48,
                 (list<bdNodeId,_std::allocator<bdNodeId>_> *)local_78);
      p_Var5 = (_List_node_base *)local_78._0_8_;
      if ((_List_node_base *)local_78._0_8_ != (_List_node_base *)local_78) {
        do {
          p_Var1 = p_Var5->_M_next;
          operator_delete(p_Var5,0x28);
          p_Var5 = p_Var1;
        } while (p_Var1 != (_List_node_base *)local_78);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x100);
    lVar3 = 0;
    do {
      Crawler::extractToCheckList
                ((crawlers->super__Vector_base<Crawler_*,_std::allocator<Crawler_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar3],
                 (list<bdNodeId,_std::allocator<bdNodeId>_> *)&local_48);
      Crawler::enableDht((crawlers->super__Vector_base<Crawler_*,_std::allocator<Crawler_*>_>).
                         _M_impl.super__Vector_impl_data._M_start[lVar3],true);
      Crawler::enable((crawlers->super__Vector_base<Crawler_*,_std::allocator<Crawler_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar3],true);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x100);
    uVar6 = (int)local_50 + 1;
    uVar7 = (ulong)uVar6;
  } while (uVar6 != 4);
  lVar3 = 0;
  do {
    Crawler::enable((crawlers->super__Vector_base<Crawler_*,_std::allocator<Crawler_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar3],false);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x100);
  uVar7 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Waiting for crawler ",0x14);
    cVar4 = '\x03' - (uVar7 < 100);
    if (uVar7 < 10) {
      cVar4 = '\x01';
    }
    local_78._0_8_ = local_78 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_78,cVar4);
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)local_78._0_8_,local_78._8_4_,(uint)uVar7);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_78._0_8_,
                        CONCAT44(local_78._12_4_,local_78._8_4_));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if ((_List_node_base *)local_78._0_8_ != (_List_node_base *)(local_78 + 0x10)) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
    Crawler::enableDht((crawlers->super__Vector_base<Crawler_*,_std::allocator<Crawler_*>_>)._M_impl
                       .super__Vector_impl_data._M_start[uVar7],false);
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0x100);
  Logger::enable(local_58,false);
  p_Var5 = local_48._M_next;
  while (p_Var5 != &local_48) {
    p_Var1 = (((_List_base<bdNodeId,_std::allocator<bdNodeId>_> *)&p_Var5->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    operator_delete(p_Var5,0x28);
    p_Var5 = p_Var1;
  }
  return;
}

Assistant:

void firstStage(std::vector<Crawler*>& crawlers, Logger& logger) {
    // Launch crawlers and logger
    for (unsigned int i = 0; i < CRAWLERS_COUNT; i++)
        crawlers[i]->startDht();
    logger.enable(true);

    std::list<bdNodeId> tempIDStorage;
    for (unsigned int i = 0; i < CRAWLS_COUNT; i++) {
        // Waiting for crawlers duty
        sleep(CRAWL_DURATION);
        // Get the previously found peers
        tempIDStorage.merge(Logger::getDiscoveredPeers());
        // Sorting out of region IDs
        for (unsigned int j = 0; j < CRAWLERS_COUNT; j++)
            crawlers[j]->enable(false);
        for (unsigned int j = 0; j < CRAWLERS_COUNT; j++) {
            std::cerr << "Waiting for crawler " << std::to_string(j) << std::endl;
            crawlers[j]->enableDht(false);
        }
        for (unsigned int j = 0; j < CRAWLERS_COUNT; j++)
            // Get the found nodes lists
            tempIDStorage.merge(crawlers[j]->getToCheckList());
        for (unsigned int j = 0; j < CRAWLERS_COUNT; j++) {
            // Restart nodes, not to hold the handler for too long
//            crawlers[j]->restart();
            // Inject new peers to check and activate crawlers
            crawlers[j]->extractToCheckList(tempIDStorage);
            crawlers[j]->enableDht(true);
            crawlers[j]->enable(true);
        }
    }
    // Pause crawling and logging
    for (unsigned int i = 0; i < CRAWLERS_COUNT; i++)
        crawlers[i]->enable(false);
    for (unsigned int i = 0; i < CRAWLERS_COUNT; i++) {
        std::cerr << "Waiting for crawler " << std::to_string(i) << std::endl;
        crawlers[i]->enableDht(false);
    }
    logger.enable(false);
}